

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2413.c
# Opt level: O0

void ym2413_update_one(void *_chip,UINT32 length,DEV_SMPL **buffers)

{
  byte bVar1;
  DEV_SMPL *pDVar2;
  DEV_SMPL *pDVar3;
  uint local_44;
  UINT32 i;
  DEV_SMPL *bufRO;
  DEV_SMPL *bufMO;
  UINT8 rhythm;
  YM2413 *chip;
  DEV_SMPL **buffers_local;
  UINT32 length_local;
  void *_chip_local;
  
  bVar1 = *(byte *)((long)_chip + 0x6a0);
  pDVar2 = *buffers;
  pDVar3 = buffers[1];
  for (local_44 = 0; local_44 < length; local_44 = local_44 + 1) {
    *(undefined4 *)((long)_chip + 0x1780) = 0;
    *(undefined4 *)((long)_chip + 0x1784) = 0;
    advance_lfo((YM2413 *)_chip);
    chan_calc((YM2413 *)_chip,(OPLL_CH *)((long)_chip + 8));
    chan_calc((YM2413 *)_chip,(OPLL_CH *)((long)_chip + 0xc0));
    chan_calc((YM2413 *)_chip,(OPLL_CH *)((long)_chip + 0x178));
    chan_calc((YM2413 *)_chip,(OPLL_CH *)((long)_chip + 0x230));
    chan_calc((YM2413 *)_chip,(OPLL_CH *)((long)_chip + 0x2e8));
    chan_calc((YM2413 *)_chip,(OPLL_CH *)((long)_chip + 0x3a0));
    if (*(char *)((long)_chip + 0x1769) == '\0') {
      if ((bVar1 & 0x20) == 0) {
        chan_calc((YM2413 *)_chip,(OPLL_CH *)((long)_chip + 0x458));
        chan_calc((YM2413 *)_chip,(OPLL_CH *)((long)_chip + 0x510));
        chan_calc((YM2413 *)_chip,(OPLL_CH *)((long)_chip + 0x5c8));
      }
      else {
        rhythm_calc((YM2413 *)_chip,(OPLL_CH *)((long)_chip + 8),*(uint *)((long)_chip + 0x6bc) & 1)
        ;
      }
    }
    pDVar2[local_44] = *(int *)((long)_chip + 0x1780) + *(int *)((long)_chip + 0x1784);
    pDVar3[local_44] = *(int *)((long)_chip + 0x1780) + *(int *)((long)_chip + 0x1784);
    advance((YM2413 *)_chip);
  }
  return;
}

Assistant:

static void ym2413_update_one(void *_chip, UINT32 length, DEV_SMPL **buffers)
{
	YM2413		*chip  = (YM2413 *)_chip;
	UINT8		rhythm = chip->rhythm&0x20;
	DEV_SMPL	*bufMO = buffers[0];
	DEV_SMPL	*bufRO = buffers[1];

	UINT32 i;

	for( i=0; i < length ; i++ )
	{
		chip->output[0] = 0;
		chip->output[1] = 0;

		advance_lfo(chip);

		/* FM part */
		chan_calc(chip, &chip->P_CH[0]);
		chan_calc(chip, &chip->P_CH[1]);
		chan_calc(chip, &chip->P_CH[2]);
		chan_calc(chip, &chip->P_CH[3]);
		chan_calc(chip, &chip->P_CH[4]);
		chan_calc(chip, &chip->P_CH[5]);

		if (! chip->VRC7_Mode)
		{
			if(!rhythm)
			{
				chan_calc(chip, &chip->P_CH[6]);
				chan_calc(chip, &chip->P_CH[7]);
				chan_calc(chip, &chip->P_CH[8]);
			}
			else        /* Rhythm part */
			{
				rhythm_calc(chip, &chip->P_CH[0], chip->noise_rng & 1 );
			}
		}

		bufMO[i] = chip->output[0] + chip->output[1];
		bufRO[i] = chip->output[0] + chip->output[1];

		advance(chip);
	}
}